

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIO.cpp
# Opt level: O2

void testIO(string *tempDir)

{
  uint __line;
  char cVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  char *__function;
  PixelType PVar8;
  char *__assertion;
  Header hdr;
  uint uStack_114;
  Header hdr2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined8 local_80;
  FlatImage img1;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing I/O based on image and file type");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hdr2,tempDir,
                 "io.exr");
  _hdr = 0;
  uStack_114 = 0;
  Imf_3_2::FlatImage::FlatImage(&img1,(Box *)&hdr,ONE_LEVEL,ROUND_DOWN);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hdr,"H",(allocator<char> *)&local_a0);
  PVar8 = (PixelType)&hdr;
  Imf_3_2::Image::insertChannel((string *)&img1,PVar8,1,1,true);
  std::__cxx11::string::~string((string *)&hdr);
  Imf_3_2::saveImage((string *)&hdr2,(Image *)&img1);
  local_a0._M_dataplus._M_p = (pointer)0x0;
  Imf_3_2::Header::Header((Header *)0x3f800000,0x3f800000,&hdr,0x40,0x40,&local_a0,0,3);
  plVar5 = (long *)Imf_3_2::loadImage((string *)&hdr2,&hdr);
  if (plVar5 != (long *)0x0) {
    lVar6 = __dynamic_cast(plVar5,&Imf_3_2::Image::typeinfo,&Imf_3_2::FlatImage::typeinfo);
    if (lVar6 != 0) {
      iVar3 = Imf_3_2::Image::levelMode();
      if (iVar3 == 0) {
        iVar3 = Imf_3_2::Image::levelRoundingMode();
        if (iVar3 == 0) {
          cVar1 = Imf_3_2::Header::hasTileDescription();
          if (cVar1 == '\0') {
            (**(code **)(*plVar5 + 8))(plVar5);
            Imf_3_2::Header::~Header(&hdr);
            Imf_3_2::FlatImage::~FlatImage(&img1);
            std::__cxx11::string::~string((string *)&hdr2);
            std::operator+(&local_a0,tempDir,"io.exr");
            _hdr = 0;
            uStack_114 = 0;
            Imf_3_2::FlatImage::FlatImage(&img1,(Box *)&hdr,ONE_LEVEL,ROUND_DOWN);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&hdr,"H",(allocator<char> *)&hdr2);
            Imf_3_2::Image::insertChannel((string *)&img1,PVar8,1,1,true);
            std::__cxx11::string::~string((string *)&hdr);
            _hdr2 = (pointer)0x0;
            Imf_3_2::Header::Header((Header *)0x3f800000,0x3f800000,&hdr,0x40,0x40,&hdr2,0,3);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&hdr2,"it\'s raining",(allocator<char> *)&local_80);
            Imf_3_2::addComments(&hdr,(string *)&hdr2);
            std::__cxx11::string::~string((string *)&hdr2);
            Imf_3_2::saveImage((string *)&local_a0,&hdr,(Image *)&img1,USE_IMAGE_DATA_WINDOW);
            local_80 = 0;
            Imf_3_2::Header::Header((Header *)0x3f800000,0x3f800000,&hdr2,0x40,0x40,&local_80,0,3);
            plVar5 = (long *)Imf_3_2::loadImage((string *)&local_a0,&hdr2);
            if (plVar5 != (long *)0x0) {
              lVar6 = __dynamic_cast(plVar5,&Imf_3_2::Image::typeinfo,&Imf_3_2::FlatImage::typeinfo)
              ;
              if (lVar6 != 0) {
                iVar3 = Imf_3_2::Image::levelMode();
                if (iVar3 == 0) {
                  iVar3 = Imf_3_2::Image::levelRoundingMode();
                  if (iVar3 == 0) {
                    cVar1 = Imf_3_2::Header::hasTileDescription();
                    if (cVar1 == '\0') {
                      cVar1 = Imf_3_2::hasComments(&hdr2);
                      if (cVar1 == '\0') {
                        __assertion = "hasComments (hdr2)";
                        __function = 
                        "void (anonymous namespace)::testFlatScanLineImage2(const string &)";
                        __line = 0x40;
                      }
                      else {
                        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)Imf_3_2::comments_abi_cxx11_(&hdr2);
                        bVar2 = std::operator==(pbVar7,"it\'s raining");
                        if (bVar2) {
                          (**(code **)(*plVar5 + 8))(plVar5);
                          Imf_3_2::Header::~Header(&hdr2);
                          Imf_3_2::Header::~Header(&hdr);
                          Imf_3_2::FlatImage::~FlatImage(&img1);
                          std::__cxx11::string::~string((string *)&local_a0);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&img1,tempDir,"io.exr");
                          anon_unknown.dwarf_23492::testFlatTiledImage1((string *)&img1);
                          std::__cxx11::string::~string((string *)&img1);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&img1,tempDir,"io.exr");
                          anon_unknown.dwarf_23492::testFlatTiledImage1((string *)&img1);
                          std::__cxx11::string::~string((string *)&img1);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&hdr2,tempDir,"io.exr");
                          _hdr = 0;
                          uStack_114 = 0;
                          Imf_3_2::DeepImage::DeepImage
                                    ((DeepImage *)&img1,(Box *)&hdr,ONE_LEVEL,ROUND_DOWN);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&hdr,"H",(allocator<char> *)&local_a0);
                          Imf_3_2::Image::insertChannel((string *)&img1,PVar8,1,1,true);
                          std::__cxx11::string::~string((string *)&hdr);
                          Imf_3_2::saveImage((string *)&hdr2,(Image *)&img1);
                          local_a0._M_dataplus._M_p = (pointer)0x0;
                          Imf_3_2::Header::Header
                                    ((Header *)0x3f800000,0x3f800000,&hdr,0x40,0x40,&local_a0,0,3);
                          plVar5 = (long *)Imf_3_2::loadImage((string *)&hdr2,&hdr);
                          if (plVar5 != (long *)0x0) {
                            lVar6 = __dynamic_cast(plVar5,&Imf_3_2::Image::typeinfo,
                                                   &Imf_3_2::DeepImage::typeinfo);
                            if (lVar6 != 0) {
                              iVar3 = Imf_3_2::Image::levelMode();
                              if (iVar3 == 0) {
                                iVar3 = Imf_3_2::Image::levelRoundingMode();
                                if (iVar3 == 0) {
                                  cVar1 = Imf_3_2::Header::hasTileDescription();
                                  if (cVar1 == '\0') {
                                    (**(code **)(*plVar5 + 8))(plVar5);
                                    Imf_3_2::Header::~Header(&hdr);
                                    Imf_3_2::DeepImage::~DeepImage((DeepImage *)&img1);
                                    std::__cxx11::string::~string((string *)&hdr2);
                                    std::operator+(&local_a0,tempDir,"io.exr");
                                    _hdr = 0;
                                    uStack_114 = 0;
                                    Imf_3_2::DeepImage::DeepImage
                                              ((DeepImage *)&img1,(Box *)&hdr,ONE_LEVEL,ROUND_DOWN);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&hdr,"H",(allocator<char> *)&hdr2);
                                    Imf_3_2::Image::insertChannel((string *)&img1,PVar8,1,1,true);
                                    std::__cxx11::string::~string((string *)&hdr);
                                    _hdr2 = (pointer)0x0;
                                    Imf_3_2::Header::Header
                                              ((Header *)0x3f800000,0x3f800000,&hdr,0x40,0x40,&hdr2,
                                               0,3);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&hdr2,"it\'s raining",
                                               (allocator<char> *)&local_80);
                                    Imf_3_2::addComments(&hdr,(string *)&hdr2);
                                    std::__cxx11::string::~string((string *)&hdr2);
                                    Imf_3_2::saveImage((string *)&local_a0,&hdr,(Image *)&img1,
                                                       USE_IMAGE_DATA_WINDOW);
                                    local_80 = 0;
                                    Imf_3_2::Header::Header
                                              ((Header *)0x3f800000,0x3f800000,&hdr2,0x40,0x40,
                                               &local_80,0,3);
                                    plVar5 = (long *)Imf_3_2::loadImage((string *)&local_a0,&hdr2);
                                    if (plVar5 != (long *)0x0) {
                                      lVar6 = __dynamic_cast(plVar5,&Imf_3_2::Image::typeinfo,
                                                             &Imf_3_2::DeepImage::typeinfo);
                                      if (lVar6 != 0) {
                                        iVar3 = Imf_3_2::Image::levelMode();
                                        if (iVar3 != 0) {
                                          __assert_fail("img2->levelMode () == ONE_LEVEL",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                                  ,0x91,
                                                  "void (anonymous namespace)::testDeepScanLineImage2(const string &)"
                                                  );
                                        }
                                        iVar3 = Imf_3_2::Image::levelRoundingMode();
                                        if (iVar3 != 0) {
                                          __assert_fail("img2->levelRoundingMode () == ROUND_DOWN",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                                  ,0x92,
                                                  "void (anonymous namespace)::testDeepScanLineImage2(const string &)"
                                                  );
                                        }
                                        cVar1 = Imf_3_2::Header::hasTileDescription();
                                        if (cVar1 != '\0') {
                                          __assert_fail("!hdr2.hasTileDescription ()",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                                  ,0x93,
                                                  "void (anonymous namespace)::testDeepScanLineImage2(const string &)"
                                                  );
                                        }
                                        cVar1 = Imf_3_2::hasComments(&hdr2);
                                        if (cVar1 != '\0') {
                                          pbVar7 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)Imf_3_2::comments_abi_cxx11_(&hdr2);
                                          bVar2 = std::operator==(pbVar7,"it\'s raining");
                                          if (!bVar2) {
                                            __assert_fail("comments (hdr2) == \"it\'s raining\"",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                                  ,0x95,
                                                  "void (anonymous namespace)::testDeepScanLineImage2(const string &)"
                                                  );
                                          }
                                          (**(code **)(*plVar5 + 8))(plVar5);
                                          Imf_3_2::Header::~Header(&hdr2);
                                          Imf_3_2::Header::~Header(&hdr);
                                          Imf_3_2::DeepImage::~DeepImage((DeepImage *)&img1);
                                          std::__cxx11::string::~string((string *)&local_a0);
                                          std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&hdr2,tempDir,"io.exr");
                                          _hdr = 0;
                                          uStack_114 = 0;
                                          Imf_3_2::DeepImage::DeepImage
                                                    ((DeepImage *)&img1,(Box *)&hdr,MIPMAP_LEVELS,
                                                     ROUND_DOWN);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&hdr,"H",(allocator<char> *)&local_a0
                                                    );
                                          Imf_3_2::Image::insertChannel
                                                    ((string *)&img1,PVar8,1,1,true);
                                          std::__cxx11::string::~string((string *)&hdr);
                                          Imf_3_2::saveImage((string *)&hdr2,(Image *)&img1);
                                          local_a0._M_dataplus._M_p = (pointer)0x0;
                                          Imf_3_2::Header::Header
                                                    ((Header *)0x3f800000,0x3f800000,&hdr,0x40,0x40,
                                                     &local_a0,0,3);
                                          plVar5 = (long *)Imf_3_2::loadImage((string *)&hdr2,&hdr);
                                          if (plVar5 != (long *)0x0) {
                                            lVar6 = __dynamic_cast(plVar5,&Imf_3_2::Image::typeinfo,
                                                                   &Imf_3_2::DeepImage::typeinfo);
                                            if (lVar6 != 0) {
                                              iVar3 = Imf_3_2::Image::levelMode();
                                              if (iVar3 != 1) {
                                                __assert_fail("img2->levelMode () == MIPMAP_LEVELS",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                                  ,0xa5,
                                                  "void (anonymous namespace)::testDeepTiledImage1(const string &)"
                                                  );
                                              }
                                              iVar3 = Imf_3_2::Image::levelRoundingMode();
                                              if (iVar3 != 0) {
                                                __assert_fail(
                                                  "img2->levelRoundingMode () == ROUND_DOWN",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                                  ,0xa6,
                                                  "void (anonymous namespace)::testDeepTiledImage1(const string &)"
                                                  );
                                              }
                                              cVar1 = Imf_3_2::Header::hasTileDescription();
                                              if (cVar1 == '\0') {
                                                __assert_fail("hdr.hasTileDescription ()",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                                  ,0xa7,
                                                  "void (anonymous namespace)::testDeepTiledImage1(const string &)"
                                                  );
                                              }
                                              (**(code **)(*plVar5 + 8))(plVar5);
                                              Imf_3_2::Header::~Header(&hdr);
                                              Imf_3_2::DeepImage::~DeepImage((DeepImage *)&img1);
                                              std::__cxx11::string::~string((string *)&hdr2);
                                              std::operator+(&local_a0,tempDir,"io.exr");
                                              _hdr = 0;
                                              uStack_114 = 0;
                                              Imf_3_2::DeepImage::DeepImage
                                                        ((DeepImage *)&img1,(Box *)&hdr,ONE_LEVEL,
                                                         ROUND_DOWN);
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&hdr,"H",(allocator<char> *)&hdr2
                                                        );
                                              Imf_3_2::Image::insertChannel
                                                        ((string *)&img1,PVar8,1,1,true);
                                              std::__cxx11::string::~string((string *)&hdr);
                                              _hdr2 = (pointer)0x0;
                                              Imf_3_2::Header::Header
                                                        ((Header *)0x3f800000,0x3f800000,&hdr,0x40,
                                                         0x40,&hdr2,0,3);
                                              _hdr2 = (pointer)0x2000000020;
                                              Imf_3_2::Header::setTileDescription
                                                        ((TileDescription *)&hdr);
                                              Imf_3_2::saveImage((string *)&local_a0,&hdr,
                                                                 (Image *)&img1,
                                                                 USE_IMAGE_DATA_WINDOW);
                                              local_80 = 0;
                                              Imf_3_2::Header::Header
                                                        ((Header *)0x3f800000,0x3f800000,&hdr2,0x40,
                                                         0x40,&local_80,0,3);
                                              plVar5 = (long *)Imf_3_2::loadImage((string *)
                                                                                  &local_a0,&hdr2);
                                              if (plVar5 != (long *)0x0) {
                                                lVar6 = __dynamic_cast(plVar5,&Imf_3_2::Image::
                                                                               typeinfo,
                                                                       &Imf_3_2::DeepImage::typeinfo
                                                                       ,0);
                                                if (lVar6 != 0) {
                                                  iVar3 = Imf_3_2::Image::levelMode();
                                                  if (iVar3 != 0) {
                                                    __assert_fail("img2->levelMode () == ONE_LEVEL",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                                  ,0xbb,
                                                  "void (anonymous namespace)::testDeepTiledImage2(const string &)"
                                                  );
                                                  }
                                                  iVar3 = Imf_3_2::Image::levelRoundingMode();
                                                  if (iVar3 == 0) {
                                                    cVar1 = Imf_3_2::Header::hasTileDescription();
                                                    if (cVar1 != '\0') {
                                                      (**(code **)(*plVar5 + 8))(plVar5);
                                                      Imf_3_2::Header::~Header(&hdr2);
                                                      Imf_3_2::Header::~Header(&hdr);
                                                      Imf_3_2::DeepImage::~DeepImage
                                                                ((DeepImage *)&img1);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_a0);
                                                      poVar4 = std::operator<<((ostream *)&std::cout
                                                                               ,"ok\n");
                                                      std::endl<char,std::char_traits<char>>(poVar4)
                                                      ;
                                                      std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&img1,tempDir,"io.exr");
                                                  remove(_img1);
                                                  std::__cxx11::string::~string((string *)&img1);
                                                  return;
                                                  }
                                                  __assert_fail("hdr2.hasTileDescription ()",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                                  ,0xbd,
                                                  "void (anonymous namespace)::testDeepTiledImage2(const string &)"
                                                  );
                                                  }
                                                  __assert_fail(
                                                  "img2->levelRoundingMode () == ROUND_DOWN",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                                  ,0xbc,
                                                  "void (anonymous namespace)::testDeepTiledImage2(const string &)"
                                                  );
                                                }
                                              }
                                              __assert_fail("dynamic_cast<DeepImage*> (img2)",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                                  ,0xba,
                                                  "void (anonymous namespace)::testDeepTiledImage2(const string &)"
                                                  );
                                            }
                                          }
                                          __assert_fail("dynamic_cast<DeepImage*> (img2)",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                                  ,0xa4,
                                                  "void (anonymous namespace)::testDeepTiledImage1(const string &)"
                                                  );
                                        }
                                        __assert_fail("hasComments (hdr2)",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                                  ,0x94,
                                                  "void (anonymous namespace)::testDeepScanLineImage2(const string &)"
                                                  );
                                      }
                                    }
                                    __assert_fail("dynamic_cast<DeepImage*> (img2)",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                                                  ,0x90,
                                                  "void (anonymous namespace)::testDeepScanLineImage2(const string &)"
                                                 );
                                  }
                                  __assertion = "!hdr.hasTileDescription ()";
                                  __function = 
                                  "void (anonymous namespace)::testDeepScanLineImage1(const string &)"
                                  ;
                                  __line = 0x7d;
                                }
                                else {
                                  __assertion = "img2->levelRoundingMode () == ROUND_DOWN";
                                  __function = 
                                  "void (anonymous namespace)::testDeepScanLineImage1(const string &)"
                                  ;
                                  __line = 0x7c;
                                }
                              }
                              else {
                                __assertion = "img2->levelMode () == ONE_LEVEL";
                                __function = 
                                "void (anonymous namespace)::testDeepScanLineImage1(const string &)"
                                ;
                                __line = 0x7b;
                              }
                              goto LAB_0010db61;
                            }
                          }
                          __assertion = "dynamic_cast<DeepImage*> (img2)";
                          __function = 
                          "void (anonymous namespace)::testDeepScanLineImage1(const string &)";
                          __line = 0x7a;
                        }
                        else {
                          __assertion = "comments (hdr2) == \"it\'s raining\"";
                          __function = 
                          "void (anonymous namespace)::testFlatScanLineImage2(const string &)";
                          __line = 0x41;
                        }
                      }
                    }
                    else {
                      __assertion = "!hdr2.hasTileDescription ()";
                      __function = 
                      "void (anonymous namespace)::testFlatScanLineImage2(const string &)";
                      __line = 0x3f;
                    }
                  }
                  else {
                    __assertion = "img2->levelRoundingMode () == ROUND_DOWN";
                    __function = 
                    "void (anonymous namespace)::testFlatScanLineImage2(const string &)";
                    __line = 0x3e;
                  }
                }
                else {
                  __assertion = "img2->levelMode () == ONE_LEVEL";
                  __function = "void (anonymous namespace)::testFlatScanLineImage2(const string &)";
                  __line = 0x3d;
                }
                goto LAB_0010db61;
              }
            }
            __assertion = "dynamic_cast<FlatImage*> (img2)";
            __function = "void (anonymous namespace)::testFlatScanLineImage2(const string &)";
            __line = 0x3c;
          }
          else {
            __assertion = "!hdr.hasTileDescription ()";
            __function = "void (anonymous namespace)::testFlatScanLineImage1(const string &)";
            __line = 0x29;
          }
        }
        else {
          __assertion = "img2->levelRoundingMode () == ROUND_DOWN";
          __function = "void (anonymous namespace)::testFlatScanLineImage1(const string &)";
          __line = 0x28;
        }
      }
      else {
        __assertion = "img2->levelMode () == ONE_LEVEL";
        __function = "void (anonymous namespace)::testFlatScanLineImage1(const string &)";
        __line = 0x27;
      }
      goto LAB_0010db61;
    }
  }
  __assertion = "dynamic_cast<FlatImage*> (img2)";
  __function = "void (anonymous namespace)::testFlatScanLineImage1(const string &)";
  __line = 0x26;
LAB_0010db61:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                ,__line,__function);
}

Assistant:

void
testIO (const string& tempDir)
{
    try
    {
        cout << "Testing I/O based on image and file type" << endl;

        testFlatScanLineImage1 (tempDir + "io.exr");
        testFlatScanLineImage2 (tempDir + "io.exr");
        testFlatTiledImage1 (tempDir + "io.exr");
        testFlatTiledImage1 (tempDir + "io.exr");
        testDeepScanLineImage1 (tempDir + "io.exr");
        testDeepScanLineImage2 (tempDir + "io.exr");
        testDeepTiledImage1 (tempDir + "io.exr");
        testDeepTiledImage2 (tempDir + "io.exr");

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
    remove ((tempDir + "io.exr").c_str ());
}